

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  Mat *pMVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  Allocator *pAVar5;
  Proposal *pPVar6;
  int iVar7;
  float *pfVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  float *pfVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 extraout_var [12];
  Mat anchors;
  void *ptr;
  float *local_c8;
  undefined8 uStack_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  int iStack_b0;
  Allocator *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  size_t sStack_90;
  float local_88;
  float local_84;
  Proposal *local_80;
  ulong local_78;
  ulong local_70;
  float *local_68;
  void *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar7 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar7;
  iVar7 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar7;
  iVar7 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar7;
  iVar7 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar7;
  fVar17 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar17;
  iVar7 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar7;
  iVar7 = this->base_size;
  uVar2 = (this->ratios).w;
  local_70 = (ulong)uVar2;
  iVar10 = (this->scales).w;
  local_78 = (ulong)iVar10;
  iVar10 = iVar10 * uVar2;
  local_c8 = (float *)0x0;
  uStack_c0._0_4_ = 0;
  uStack_c0._4_4_ = 0;
  uStack_c0 = (float *)0x0;
  uStack_b8 = 4;
  uStack_b4 = 0;
  iStack_b0 = 1;
  local_a8 = (Allocator *)0x0;
  uStack_a0 = 0x400000002;
  local_98 = CONCAT44(1,iVar10);
  sVar15 = (size_t)(iVar10 * 4);
  sStack_90 = sVar15;
  if (iVar10 != 0) {
    local_68 = (float *)0x0;
    iVar10 = posix_memalign(&local_68,0x10,sVar15 * 4 + 4);
    if (iVar10 != 0) {
      local_68 = (float *)0x0;
    }
    local_c8 = local_68;
    uStack_c0 = local_68 + sVar15;
    local_68[sVar15] = 1.4013e-45;
  }
  local_80 = this;
  if (0 < (int)local_70) {
    local_88 = (float)iVar7;
    uVar14 = local_78 & 0xffffffff;
    local_58 = local_88 * 0.5;
    local_60 = (this->ratios).data;
    pvVar3 = (this->scales).data;
    lVar11 = (long)uStack_a0._4_4_ * CONCAT44(uStack_b4,uStack_b8);
    lVar13 = lVar11 * local_78;
    uVar12 = 0;
    pfVar16 = local_c8;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      if (0 < (int)local_78) {
        local_84 = *(float *)((long)local_60 + uVar12 * 4);
        auVar20 = rsqrtss(ZEXT816(0),ZEXT416((uint)local_84));
        fVar17 = auVar20._0_4_;
        fVar17 = roundf(fVar17 * -0.5 * local_88 * (local_84 * fVar17 * fVar17 + -3.0));
        local_48 = (float)(int)fVar17;
        fStack_44 = (float)(int)extraout_var._0_4_;
        fStack_40 = (float)(int)extraout_var._4_4_;
        fStack_3c = (float)(int)extraout_var._8_4_;
        fVar17 = roundf(local_84 * local_48);
        uVar9 = 0;
        pfVar8 = pfVar16;
        do {
          fVar18 = *(float *)((long)pvVar3 + uVar9 * 4) * 0.5;
          fVar19 = fVar18 * local_48;
          fVar18 = fVar18 * (float)(int)fVar17;
          *pfVar8 = local_58 - fVar19;
          pfVar8[1] = fStack_54 - fVar18;
          pfVar8[2] = fVar19 + fStack_50;
          pfVar8[3] = fVar18 + fStack_4c;
          uVar9 = uVar9 + 1;
          pfVar8 = (float *)((long)pfVar8 + lVar11);
        } while (uVar14 != uVar9);
      }
      uVar12 = uVar12 + 1;
      pfVar16 = (float *)((long)pfVar16 + lVar13);
    } while (uVar12 != local_70);
  }
  pPVar6 = local_80;
  pMVar1 = &local_80->anchors;
  if (pMVar1 != (Mat *)&local_c8) {
    if (uStack_c0 != (float *)0x0) {
      LOCK();
      *uStack_c0 = (float)((int)*uStack_c0 + 1);
      UNLOCK();
    }
    piVar4 = (local_80->anchors).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar3 = (local_80->anchors).data;
        pAVar5 = (local_80->anchors).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar5 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(pPVar6->anchors).refcount + 4) = 0;
    *(undefined8 *)((long)&(pPVar6->anchors).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (pPVar6->anchors).refcount = (int *)0x0;
    (pPVar6->anchors).dims = 0;
    (pPVar6->anchors).w = 0;
    (pPVar6->anchors).h = 0;
    (pPVar6->anchors).c = 0;
    (pPVar6->anchors).cstep = 0;
    (pPVar6->anchors).data = local_c8;
    (pPVar6->anchors).refcount = (int *)uStack_c0;
    (pPVar6->anchors).elemsize = CONCAT44(uStack_b4,uStack_b8);
    (pPVar6->anchors).elempack = iStack_b0;
    (pPVar6->anchors).allocator = local_a8;
    (pPVar6->anchors).dims = (undefined4)uStack_a0;
    (pPVar6->anchors).w = uStack_a0._4_4_;
    (pPVar6->anchors).h = (undefined4)local_98;
    (pPVar6->anchors).c = local_98._4_4_;
    (pPVar6->anchors).cstep = sStack_90;
  }
  if (uStack_c0 != (float *)0x0) {
    LOCK();
    *uStack_c0 = (float)((int)*uStack_c0 + -1);
    UNLOCK();
    if (*uStack_c0 == 0.0) {
      if (local_a8 == (Allocator *)0x0) {
        if (local_c8 != (float *)0x0) {
          free(local_c8);
        }
      }
      else {
        (**(code **)(*(long *)local_a8 + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

//     Mat ratio;
//     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}